

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::ChangeDimension(ON_NurbsSurface *this,int desired_dimension)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  double dVar22;
  long local_90;
  
  if ((0 < desired_dimension) && (this->m_dim != desired_dimension)) {
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    uVar1 = this->m_dim;
    uVar20 = (ulong)(uint)desired_dimension;
    if (desired_dimension < (int)uVar1) {
      if (this->m_is_rat != 0) {
        iVar18 = this->m_cv_count[1];
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        iVar15 = this->m_cv_count[0];
        iVar9 = 0;
        if (iVar15 < 1) {
          iVar15 = 0;
          iVar9 = 0;
        }
        for (; iVar9 != iVar15; iVar9 = iVar9 + 1) {
          for (iVar21 = 0; iVar18 != iVar21; iVar21 = iVar21 + 1) {
            pdVar3 = CV(this,iVar9,iVar21);
            pdVar3[uVar20] = pdVar3[uVar1];
          }
        }
      }
    }
    else {
      iVar18 = this->m_cv_stride[0];
      iVar15 = this->m_cv_stride[1];
      iVar2 = (desired_dimension + 1) - (uint)(this->m_is_rat == 0);
      iVar21 = iVar18;
      iVar9 = iVar15;
      if (iVar15 < iVar2 && iVar18 < iVar2) {
        iVar10 = this->m_cv_count[0] * iVar2;
        iVar9 = iVar10;
        iVar21 = 1;
        if (iVar15 < iVar18) {
          iVar9 = iVar2;
          iVar21 = this->m_cv_count[1];
        }
        iVar21 = iVar21 * iVar2;
        ReserveCVCapacity(this,iVar10 * this->m_cv_count[1]);
      }
      lVar11 = (long)iVar18;
      lVar12 = (long)iVar15;
      if (iVar15 < iVar18) {
        lVar13 = (long)this->m_cv_count[0];
        iVar18 = this->m_cv_count[1];
        lVar14 = (long)iVar9;
        lVar7 = (long)iVar21;
        lVar5 = (long)iVar18 + -1;
        lVar16 = lVar5 * lVar14 * 8 + (lVar13 + -1) * lVar7 * 8 + -8;
        lVar5 = lVar5 * lVar12 * 8 + (lVar13 + -1) * lVar11 * 8 + -8;
        while (0 < lVar13) {
          lVar13 = lVar13 + -1;
          pdVar3 = this->m_cv;
          uVar1 = this->m_dim;
          iVar15 = this->m_is_rat;
          lVar19 = (long)pdVar3 + lVar16;
          lVar8 = (long)pdVar3 + lVar5;
          lVar6 = (long)iVar18;
          while (0 < lVar6) {
            lVar6 = lVar6 + -1;
            uVar17 = uVar20;
            if (iVar15 == 0) goto LAB_0055939b;
            dVar22 = pdVar3[lVar13 * lVar11 + lVar6 * lVar12 + (long)(int)uVar1];
            while( true ) {
              pdVar3[lVar13 * lVar7 + lVar6 * lVar14 + uVar17] = dVar22;
LAB_0055939b:
              uVar4 = (ulong)uVar1;
              if ((long)uVar17 <= (long)(int)uVar1) break;
              uVar17 = uVar17 - 1;
              dVar22 = 0.0;
            }
            for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
              *(undefined8 *)(lVar19 + uVar4 * 8) = *(undefined8 *)(lVar8 + uVar4 * 8);
            }
            lVar19 = lVar19 + lVar14 * -8;
            lVar8 = lVar8 + lVar12 * -8;
          }
          lVar16 = lVar16 + lVar7 * -8;
          lVar5 = lVar5 + lVar11 * -8;
        }
      }
      else {
        lVar14 = (long)this->m_cv_count[1];
        iVar18 = this->m_cv_count[0];
        lVar16 = (long)iVar21;
        lVar7 = (long)iVar9;
        lVar5 = (long)iVar18 + -1;
        lVar13 = lVar5 * lVar16 * 8 + (lVar14 + -1) * lVar7 * 8 + -8;
        local_90 = lVar5 * lVar11 * 8 + (lVar14 + -1) * lVar12 * 8 + -8;
        while (0 < lVar14) {
          lVar14 = lVar14 + -1;
          pdVar3 = this->m_cv;
          uVar1 = this->m_dim;
          iVar15 = this->m_is_rat;
          lVar5 = (long)pdVar3 + lVar13;
          lVar6 = (long)pdVar3 + local_90;
          lVar19 = (long)iVar18;
          while (0 < lVar19) {
            lVar19 = lVar19 + -1;
            uVar17 = uVar20;
            if (iVar15 == 0) goto LAB_00559501;
            dVar22 = pdVar3[lVar14 * lVar12 + lVar19 * lVar11 + (long)(int)uVar1];
            while( true ) {
              pdVar3[lVar14 * lVar7 + lVar19 * lVar16 + uVar17] = dVar22;
LAB_00559501:
              uVar4 = (ulong)uVar1;
              if ((long)uVar17 <= (long)(int)uVar1) break;
              uVar17 = uVar17 - 1;
              dVar22 = 0.0;
            }
            for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
              *(undefined8 *)(lVar5 + uVar4 * 8) = *(undefined8 *)(lVar6 + uVar4 * 8);
            }
            lVar5 = lVar5 + lVar16 * -8;
            lVar6 = lVar6 + lVar11 * -8;
          }
          lVar13 = lVar13 + lVar7 * -8;
          local_90 = local_90 + lVar12 * -8;
        }
      }
      this->m_cv_stride[0] = iVar21;
      this->m_cv_stride[1] = iVar9;
    }
    this->m_dim = desired_dimension;
  }
  return 0 < desired_dimension;
}

Assistant:

bool ON_NurbsSurface::ChangeDimension(
          int desired_dimension  //  desired_dimension
          )
{
  bool rc = false;
  int i, j, k;
  if ( desired_dimension < 1 )
    return false;
  if ( desired_dimension == m_dim )
    return true;

  DestroySurfaceTree();

  if ( desired_dimension < m_dim ) 
  {
    if ( m_is_rat ) {
      double* cv;
      for ( i = 0; i < m_cv_count[0]; i++ ) 
      {
        for ( j = 0; j < m_cv_count[1]; j++ ) 
        {
          cv = CV(i,j);
          cv[desired_dimension] = cv[m_dim];
        }
      }
    }
    m_dim = desired_dimension;
    rc = true;
  }
  else 
  {
    const double* old_cv;
    double* new_cv;
    //const int old_cv_size = m_is_rat ? (m_dim + 1) : m_dim;
    const int old_stride0 = m_cv_stride[0];
    const int old_stride1 = m_cv_stride[1];
    const int cv_size = m_is_rat ? (desired_dimension + 1) : desired_dimension;
    int new_stride0 = old_stride0;
    int new_stride1 = old_stride1;
    if ( cv_size > old_stride0 && cv_size > old_stride1 )
    {      
      new_stride0 = (old_stride0 <= old_stride1) ? cv_size : (cv_size*m_cv_count[1]);
      new_stride1 = (old_stride0 <= old_stride1) ? (cv_size*m_cv_count[0]) : cv_size;
      ReserveCVCapacity(cv_size*m_cv_count[0]*m_cv_count[1]);
    }

    if ( old_stride0 <= old_stride1 )
    {
      for ( j = m_cv_count[1]-1; j >= 0; j-- )
      {
        for ( i = m_cv_count[0]-1; i >= 0; i-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    else
    {
      for ( i = m_cv_count[0]-1; i >= 0; i-- )
      {
        for ( j = m_cv_count[1]-1; j >= 0; j-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    m_cv_stride[0] = new_stride0;
    m_cv_stride[1] = new_stride1;
    m_dim = desired_dimension;
    rc = true;
  }
  return rc;
}